

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillRow(PixelBufferAccess *dst,int y,int z,int pixelSize,deUint8 *pixel)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int iVar3;
  deBool dVar4;
  void *ptr;
  int local_54;
  int local_50;
  int j;
  int i_2;
  int i_1;
  deUint32 val_1;
  int i;
  deUint64 val;
  int width;
  deUint8 *dstPtr;
  deUint8 *pixel_local;
  int pixelSize_local;
  int z_local;
  int y_local;
  PixelBufferAccess *dst_local;
  
  ptr = PixelBufferAccess::getPixelPtr(dst,0,y,z);
  iVar3 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  if ((pixelSize == 8) && (dVar4 = deIsAlignedPtr(ptr,8), dVar4 != 0)) {
    uVar2 = *(undefined8 *)pixel;
    for (i_1 = 0; i_1 < iVar3; i_1 = i_1 + 1) {
      *(undefined8 *)((long)ptr + (long)i_1 * 8) = uVar2;
    }
  }
  else if ((pixelSize == 4) && (dVar4 = deIsAlignedPtr(ptr,4), dVar4 != 0)) {
    uVar1 = *(undefined4 *)pixel;
    for (j = 0; j < iVar3; j = j + 1) {
      *(undefined4 *)((long)ptr + (long)j * 4) = uVar1;
    }
  }
  else {
    for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
      for (local_54 = 0; local_54 < pixelSize; local_54 = local_54 + 1) {
        *(deUint8 *)((long)ptr + (long)(local_50 * pixelSize + local_54)) = pixel[local_54];
      }
    }
  }
  return;
}

Assistant:

inline void fillRow (const PixelBufferAccess& dst, int y, int z, int pixelSize, const deUint8* pixel)
{
	DE_ASSERT(dst.getPixelPitch() == pixelSize); // only tightly packed

	deUint8*	dstPtr	= (deUint8*)dst.getPixelPtr(0, y, z);
	int			width	= dst.getWidth();

	if (pixelSize == 8 && deIsAlignedPtr(dstPtr, pixelSize))
	{
		deUint64 val;
		memcpy(&val, pixel, sizeof(val));

		for (int i = 0; i < width; i++)
			((deUint64*)dstPtr)[i] = val;
	}
	else if (pixelSize == 4 && deIsAlignedPtr(dstPtr, pixelSize))
	{
		deUint32 val;
		memcpy(&val, pixel, sizeof(val));

		for (int i = 0; i < width; i++)
			((deUint32*)dstPtr)[i] = val;
	}
	else
	{
		for (int i = 0; i < width; i++)
			for (int j = 0; j < pixelSize; j++)
				dstPtr[i*pixelSize+j] = pixel[j];
	}
}